

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O1

void __thiscall
GdlAttrValueSpec::AdjustToIOIndices
          (GdlAttrValueSpec *this,GdlRuleItem *prit,vector<int,_std::allocator<int>_> *viritInput,
          vector<int,_std::allocator<int>_> *viritOutput)

{
  bool bVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  GdlExpression *pGVar2;
  
  if (this->m_psymName->m_expt == kexptSlotRef) {
    bVar1 = GrcSymbolTableEntry::IsComponentRef(this->m_psymName);
    if (!bVar1) {
      bVar1 = GrcSymbolTableEntry::IsAttachment(this->m_psymName);
      if (!bVar1) {
        return;
      }
      pGVar2 = this->m_pexpValue;
      UNRECOVERED_JUMPTABLE = pGVar2->_vptr_GdlExpression[0x17];
      viritInput = viritOutput;
      goto LAB_001418af;
    }
  }
  pGVar2 = this->m_pexpValue;
  UNRECOVERED_JUMPTABLE = pGVar2->_vptr_GdlExpression[0x17];
  prit = (GdlRuleItem *)0x0;
LAB_001418af:
  (*UNRECOVERED_JUMPTABLE)(pGVar2,viritInput,prit);
  return;
}

Assistant:

void GdlAttrValueSpec::AdjustToIOIndices(GdlRuleItem * prit,
	std::vector<int> & viritInput, std::vector<int> & viritOutput)
{
	Assert(m_psymName->FitsSymbolType(ksymtSlotAttr) || m_psymName->FitsSymbolType(ksymtFeature));

	if (m_psymName->ExpType() == kexptSlotRef)
	{
		if (m_psymName->IsComponentRef())
			m_pexpValue->AdjustToIOIndices(viritInput, NULL);
		else if (m_psymName->IsAttachment())
		{
			Assert(m_psymName->LastFieldIs("to"));	// must be attach.to
			m_pexpValue->AdjustToIOIndices(viritOutput, prit);
		}
		else
		{
			Assert(false);
		}
	}
	else
		m_pexpValue->AdjustToIOIndices(viritInput, NULL);
}